

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O1

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ArrayAccessExpression *expression)

{
  NewScopeLayer *this_00;
  pointer pcVar1;
  string local_68;
  Symbol local_48;
  
  this_00 = this->current_layer_;
  pcVar1 = (expression->array_indent_)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (expression->array_indent_)._M_string_length);
  Symbol::Symbol(&local_48,&local_68);
  NewScopeLayer::GetArrayLayer(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name_._M_dataplus._M_p != &local_48.name_.field_2) {
    operator_delete(local_48.name_._M_dataplus._M_p,local_48.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (**(expression->index_expression_->super_Node)._vptr_Node)(expression->index_expression_,this);
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ArrayAccessExpression* expression) {
  current_layer_->GetArrayLayer(Symbol(expression->array_indent_));

  expression->index_expression_->Accept(this);
}